

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::Sigmoid_Mat::forward(Sigmoid_Mat *this)

{
  undefined1 b [16];
  undefined1 b_00 [16];
  bool bVar1;
  Mat *in_RDI;
  Mat *in_stack_fffffffffffffdf8;
  Mat *a;
  Mat *in_stack_fffffffffffffe00;
  Mat *this_00;
  Mat *in_stack_fffffffffffffe30;
  Mat *a_00;
  Mat *in_stack_fffffffffffffe38;
  ll128 *in_stack_fffffffffffffe60;
  Mat *in_stack_fffffffffffffe68;
  Mat *in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  Mat *in_stack_fffffffffffffe88;
  Mat *this_01;
  Mat local_e8;
  Mat local_c0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_48;
  undefined8 local_40;
  
  Op::reinit((Op *)in_RDI);
  switch(in_RDI->order) {
  case 1:
    NeuronMat::getForward(*(NeuronMat **)(in_RDI + 1));
    local_40 = 0;
    local_48 = 0x80000;
    Mat::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    Mat::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    Mat::~Mat((Mat *)0x130dd5);
    NeuronMat::getForward(*(NeuronMat **)(in_RDI + 1));
    local_90 = 0;
    local_98 = 0x80000;
    b._8_8_ = in_stack_fffffffffffffe78;
    b._0_8_ = in_stack_fffffffffffffe70;
    Mat::operator-(in_stack_fffffffffffffe88,(ll128)b);
    Mat::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    Mat::~Mat((Mat *)0x130e42);
    break;
  case 2:
    (**(code **)**(undefined8 **)(in_RDI + 2))();
    bVar1 = Op::forwardHasNext(*(Op **)(in_RDI + 2));
    if (bVar1) {
      in_RDI->order = in_RDI->order + -1;
    }
    break;
  case 3:
    (**(code **)**(undefined8 **)&in_RDI[2].order)();
    bVar1 = Op::forwardHasNext(*(Op **)&in_RDI[2].order);
    if (bVar1) {
      in_RDI->order = in_RDI->order + -1;
    }
    break;
  case 4:
    this_00 = &local_c0;
    Mat::oneMinus_IE(in_RDI);
    Mat::operator=(this_00,in_stack_fffffffffffffdf8);
    Mat::~Mat((Mat *)0x130f3a);
    a = &local_e8;
    Mat::oneMinus_IE(in_RDI);
    Mat::operator=(this_00,a);
    Mat::~Mat((Mat *)0x130f77);
    NeuronMat::getForward(*(NeuronMat **)(in_RDI + 1));
    this_01 = (Mat *)0x80000;
    Mat::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    Mat::dot(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    NeuronMat::getForward(*(NeuronMat **)(in_RDI + 1));
    a_00 = (Mat *)0x0;
    b_00._8_8_ = in_stack_fffffffffffffe78;
    b_00._0_8_ = in_stack_fffffffffffffe70;
    Mat::operator-(this_01,(ll128)b_00);
    Mat::dot(in_stack_fffffffffffffe38,a_00);
    Mat::operator-(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    NeuronMat::getForward
              ((NeuronMat *)
               (in_RDI->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    Mat::operator=(this_00,a);
    Mat::~Mat((Mat *)0x13108b);
    Mat::~Mat((Mat *)0x131098);
    Mat::~Mat((Mat *)0x1310a2);
    Mat::~Mat((Mat *)0x1310af);
    Mat::~Mat((Mat *)0x1310bc);
    break;
  case 5:
    (*(code *)**(undefined8 **)
                in_RDI[2].val.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                super__Vector_impl_data._M_start)();
    bVar1 = Op::forwardHasNext((Op *)in_RDI[2].val.
                                     super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                                     .super__Vector_impl_data._M_start);
    if (bVar1) {
      in_RDI->order = in_RDI->order + -1;
    }
  }
  return;
}

Assistant:

void MathOp::Sigmoid_Mat::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
            *u_st = *a->getForward() + (IE >> 1);
            *u_nd = *a->getForward() - (IE >> 1);
            break;
        case 2:
//            u_st->print();
            pLTZ_f_1->forward();
//            u_st->print();
            if (pLTZ_f_1->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 3:
            pLTZ_f_2->forward();
            if (pLTZ_f_2->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 4:
            // added by curious 2020.6.4 -1 --> -IE
            *u_st = u_st_res->oneMinus_IE();
            *u_nd = u_nd_res->oneMinus_IE();
            *res->getForward() = (*a->getForward() + (IE >> 1)).dot(*u_st) - (*a->getForward() - (IE >> 1)).dot(*u_nd);
//            *res->getAux() = a->getForward()->dot(a->getForward()->oneMinus_IE());
            break;
        case 5:
            pDegRed_res->forward();
//            pDiv2mP_aux->forward();
            if (pDegRed_res->forwardHasNext()) {
                forwardRound--;
            }
            break;
        // case 5:
        //     reveal->forward();
        //     if (reveal->forwardHasNext()) {
        //         forwardRound--;
        //     }
        //     break;
        // case 6:
        //     cout << "tmp\n";
        //     tmp->print();
        //     break;
    }
}